

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_remove(roaring_bitmap_t *r,uint32_t val)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  uint8_t *puVar4;
  long lVar5;
  ushort uVar6;
  undefined8 in_RAX;
  shared_container_t *sc;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  uint8_t uVar10;
  ulong uVar11;
  uint uVar12;
  uint i;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  uint8_t newtypecode;
  undefined8 uStack_38;
  
  iVar2 = (r->high_low_container).size;
  if ((long)iVar2 != 0) {
    puVar3 = (r->high_low_container).keys;
    uVar6 = (ushort)(val >> 0x10);
    if (puVar3[(long)iVar2 + -1] != uVar6) {
      uVar13 = iVar2 - 1;
      uVar12 = 0;
      uVar14 = uVar13;
      do {
        if ((int)uVar13 < (int)uVar12) {
          i = ~uVar12;
          break;
        }
        i = uVar12 + uVar13 >> 1;
        uVar1 = *(ushort *)((long)puVar3 + (ulong)(uVar12 + uVar13 & 0xfffffffe));
        if (uVar1 < uVar6) {
          uVar12 = i + 1;
          bVar15 = true;
          i = uVar14;
        }
        else if (uVar6 < uVar1) {
          uVar13 = i - 1;
          bVar15 = true;
          i = uVar14;
        }
        else {
          bVar15 = false;
        }
        uVar14 = i;
      } while (bVar15);
      goto LAB_00104113;
    }
  }
  i = iVar2 - 1;
LAB_00104113:
  if (-1 < (int)i) {
    uVar14 = i & 0xffff;
    puVar4 = (r->high_low_container).typecodes;
    sc = (shared_container_t *)(r->high_low_container).containers[uVar14];
    uStack_38 = in_RAX;
    if (puVar4[uVar14] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar4 + uVar14);
    }
    *(shared_container_t **)((long)(r->high_low_container).containers + (ulong)(uVar14 * 8)) = sc;
    uVar10 = (r->high_low_container).typecodes[uVar14];
    piVar8 = *(int **)((long)(r->high_low_container).containers + (ulong)(uVar14 * 8));
    uStack_38._7_1_ = uVar10;
    piVar7 = (int *)container_remove(piVar8,(uint16_t)val,uVar10,(uint8_t *)((long)&uStack_38 + 7));
    if (piVar7 != piVar8) {
      container_free(piVar8,uVar10);
      (r->high_low_container).containers[i] = piVar7;
      (r->high_low_container).typecodes[i] = uStack_38._7_1_;
    }
    piVar8 = piVar7;
    uVar10 = uStack_38._7_1_;
    if (uStack_38._7_1_ == '\x04') {
      uVar10 = (uint8_t)piVar7[2];
      piVar8 = *(int **)piVar7;
    }
    iVar2 = *piVar8;
    if ((uVar10 == '\x03') || (uVar10 == '\x02')) {
      bVar15 = 0 < iVar2;
    }
    else {
      if (iVar2 == -1) {
        if (**(long **)(piVar8 + 2) == 0) {
          uVar9 = 0xffffffffffffffff;
          do {
            if (uVar9 == 0x3fe) {
              uVar11 = 0x3ff;
              break;
            }
            uVar11 = uVar9 + 1;
            lVar5 = uVar9 + 2;
            uVar9 = uVar11;
          } while ((*(long **)(piVar8 + 2))[lVar5] == 0);
          bVar15 = 0x3fe < uVar11;
        }
        else {
          bVar15 = false;
        }
      }
      else {
        bVar15 = iVar2 == 0;
      }
      bVar15 = (bool)(bVar15 ^ 1);
    }
    if (bVar15) {
      (r->high_low_container).containers[i] = piVar7;
      (r->high_low_container).typecodes[i] = uStack_38._7_1_;
    }
    else {
      ra_remove_at_index_and_free(&r->high_low_container,i);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_remove(roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    const int i = ra_get_index(&r->high_low_container, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(&r->high_low_container, (uint16_t)i);
        container_t *container = ra_get_container_at_index(
            &r->high_low_container, (uint16_t)i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_remove(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
        if (container_nonzero_cardinality(container2, newtypecode)) {
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        } else {
            ra_remove_at_index_and_free(&r->high_low_container, i);
        }
    }
}